

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_billboard_rec
               (rf_camera3d camera,rf_texture2d texture,rf_rec source_rec,rf_vec3 center,float size,
               rf_color tint)

{
  _Bool _Var1;
  rf_vec3 rVar2;
  rf_vec3 rVar3;
  rf_vec3 rVar4;
  rf_vec3 rVar5;
  float local_2b0;
  float local_284;
  float fStack_280;
  rf_vec3 d;
  float local_270;
  float local_248;
  float fStack_244;
  rf_vec3 c;
  float local_230;
  float local_208;
  float fStack_204;
  rf_vec3 b;
  float local_1f0;
  float local_1c8;
  float fStack_1c4;
  rf_vec3 a;
  rf_vec3 p2;
  rf_vec3 p1;
  rf_vec3 up;
  float fStack_c4;
  rf_vec3 right;
  undefined1 local_88 [8];
  rf_mat mat_view;
  rf_vec2 size_ratio;
  float size_local;
  rf_color tint_local;
  rf_vec3 center_local;
  float fStack_14;
  rf_rec source_rec_local;
  
  source_rec_local.x = source_rec.width;
  source_rec_local.y = source_rec.height;
  mat_view.m15 = (size * source_rec_local.y) / source_rec_local.x;
  mat_view.m11 = size;
  rf_mat_look_at((rf_mat *)local_88,camera.position,camera.target,camera.up);
  rVar2.z = mat_view.m0;
  rVar2.x = (float)local_88._0_4_;
  rVar2.y = (float)local_88._4_4_;
  rVar2 = rf_vec3_scale(rVar2,mat_view.m11 * 0.5);
  rVar3 = rf_vec3_scale((rf_vec3)ZEXT812(0x3f80000000000000),mat_view.m15 * 0.5);
  rVar4 = rf_vec3_add(rVar2,rVar3);
  rVar2 = rf_vec3_sub(rVar2,rVar3);
  rVar3 = rf_vec3_sub(center,rVar2);
  local_1f0 = rVar3.z;
  rVar5 = rf_vec3_add(center,rVar4);
  local_230 = rVar5.z;
  rVar2 = rf_vec3_add(center,rVar2);
  local_270 = rVar2.z;
  rVar4 = rf_vec3_sub(center,rVar4);
  local_2b0 = rVar4.z;
  _Var1 = rf_gfx_check_buffer_limit(4);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_enable_texture(texture.id);
  rf_gfx_begin(RF_QUADS);
  size_ratio.y._0_1_ = tint.r;
  size_ratio.y._1_1_ = tint.g;
  size_ratio.y._2_1_ = tint.b;
  size_ratio.y._3_1_ = tint.a;
  rf_gfx_color4ub(size_ratio.y._0_1_,size_ratio.y._1_1_,size_ratio.y._2_1_,size_ratio.y._3_1_);
  center_local.z = source_rec.x;
  fStack_14 = source_rec.y;
  rf_gfx_tex_coord2f(center_local.z / (float)texture.width,fStack_14 / (float)texture.height);
  local_1c8 = rVar3.x;
  fStack_1c4 = rVar3.y;
  rf_gfx_vertex3f(local_1c8,fStack_1c4,local_1f0);
  rf_gfx_tex_coord2f(center_local.z / (float)texture.width,
                     (fStack_14 + source_rec_local.y) / (float)texture.height);
  local_284 = rVar4.x;
  fStack_280 = rVar4.y;
  rf_gfx_vertex3f(local_284,fStack_280,local_2b0);
  rf_gfx_tex_coord2f((center_local.z + source_rec_local.x) / (float)texture.width,
                     (fStack_14 + source_rec_local.y) / (float)texture.height);
  local_248 = rVar2.x;
  fStack_244 = rVar2.y;
  rf_gfx_vertex3f(local_248,fStack_244,local_270);
  rf_gfx_tex_coord2f((center_local.z + source_rec_local.x) / (float)texture.width,
                     fStack_14 / (float)texture.height);
  local_208 = rVar5.x;
  fStack_204 = rVar5.y;
  rf_gfx_vertex3f(local_208,fStack_204,local_230);
  rf_gfx_end();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_billboard_rec(rf_camera3d camera, rf_texture2d texture, rf_rec source_rec, rf_vec3 center, float size, rf_color tint)
{
    // NOTE: Billboard size will maintain source_rec aspect ratio, size will represent billboard width
    rf_vec2 size_ratio = {size, size * (float)source_rec.height / source_rec.width };

    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_vec3 right = {mat_view.m0, mat_view.m4, mat_view.m8 };
    //rf_vec3 up = { mat_view.m1, mat_view.m5, mat_view.m9 };

    // NOTE: Billboard locked on axis-Y
    rf_vec3 up = {0.0f, 1.0f, 0.0f };
    /*
        a-------b
        |       |
        |   *   |
        |       |
        d-------c
    */
    right = rf_vec3_scale(right, size_ratio.x / 2);
    up = rf_vec3_scale(up, size_ratio.y / 2);

    rf_vec3 p1 = rf_vec3_add(right, up);
    rf_vec3 p2 = rf_vec3_sub(right, up);

    rf_vec3 a = rf_vec3_sub(center, p2);
    rf_vec3 b = rf_vec3_add(center, p1);
    rf_vec3 c = rf_vec3_add(center, p2);
    rf_vec3 d = rf_vec3_sub(center, p1);

    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();

    rf_gfx_enable_texture(texture.id);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);

    // Bottom-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(a.x, a.y, a.z);

    // Top-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(d.x, d.y, d.z);

    // Top-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(c.x, c.y, c.z);

    // Bottom-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(b.x, b.y, b.z);
    rf_gfx_end();

    rf_gfx_disable_texture();
}